

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void timediffFunc(sqlite3_context *context,int NotUsed1,sqlite3_value **argv)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uint local_bc;
  DateTime d2;
  DateTime local_88;
  StrAccum local_58;
  
  iVar2 = isDate(context,1,argv,&local_88);
  if (iVar2 == 0) {
    iVar2 = isDate(context,1,argv + 1,&d2);
    if (iVar2 == 0) {
      computeYMD(&local_88);
      computeHMS(&local_88);
      computeYMD(&d2);
      computeHMS(&d2);
      if (local_88.iJD < d2.iJD) {
        iVar2 = d2.Y - local_88.Y;
        if (iVar2 != 0) {
          d2.Y = local_88.Y;
          d2.validJD = '\0';
          computeJD(&d2);
        }
        uVar3 = d2.M - local_88.M;
        uVar4 = uVar3 + 0xc;
        if (-1 < (int)uVar3) {
          uVar4 = uVar3;
        }
        uVar5 = (ulong)uVar4;
        if (uVar4 != 0) {
          d2.M = local_88.M;
          d2.validJD = '\0';
          computeJD(&d2);
        }
        uVar4 = iVar2 + ((int)uVar3 >> 0x1f);
        if (d2.iJD < local_88.iJD) {
          do {
            iVar2 = (int)uVar5;
            uVar3 = iVar2 - 1;
            if (iVar2 < 1) {
              uVar3 = 0xb;
            }
            uVar5 = (ulong)uVar3;
            bVar1 = 0xb < d2.M;
            d2.M = d2.M + 1;
            if (bVar1) {
              d2.M = 1;
              d2.Y = d2.Y + 1;
            }
            uVar4 = uVar4 - (iVar2 < 1);
            d2.validJD = '\0';
            computeJD(&d2);
          } while (d2.iJD < local_88.iJD);
        }
        local_88.iJD = d2.iJD - local_88.iJD;
        local_bc = 0x2d;
      }
      else {
        iVar2 = local_88.Y - d2.Y;
        if (iVar2 != 0) {
          d2.Y = local_88.Y;
          d2.validJD = '\0';
          computeJD(&d2);
        }
        uVar3 = local_88.M - d2.M;
        uVar4 = (local_88.M + 0xc) - d2.M;
        if (-1 < (int)uVar3) {
          uVar4 = uVar3;
        }
        uVar5 = (ulong)uVar4;
        if (uVar4 != 0) {
          d2.M = local_88.M;
          d2.validJD = '\0';
          computeJD(&d2);
        }
        uVar4 = iVar2 + ((int)uVar3 >> 0x1f);
        if (local_88.iJD < d2.iJD) {
          do {
            iVar2 = (int)uVar5;
            uVar3 = iVar2 - 1;
            if (iVar2 < 1) {
              uVar3 = 0xb;
            }
            uVar5 = (ulong)uVar3;
            bVar1 = d2.M < 2;
            d2.M = d2.M + -1;
            if (bVar1) {
              d2.M = 0xc;
              d2.Y = d2.Y + -1;
            }
            uVar4 = uVar4 - (iVar2 < 1);
            d2.validJD = '\0';
            computeJD(&d2);
          } while (local_88.iJD < d2.iJD);
        }
        local_88.iJD = local_88.iJD - d2.iJD;
        local_bc = 0x2b;
      }
      local_88.iJD = local_88.iJD + 0x873dcf4ec200;
      local_88.validYMD = '\0';
      local_88.validHMS = '\0';
      local_88.tz = 0;
      computeYMD(&local_88);
      computeHMS(&local_88);
      local_58.db = (sqlite3 *)0x0;
      local_58.zText = (char *)0x0;
      local_58.nAlloc = 0;
      local_58.mxAlloc = 100;
      local_58.nChar = 0;
      local_58.accError = '\0';
      local_58.printfFlags = '\0';
      sqlite3_str_appendf(&local_58,"%c%04d-%02d-%02d %02d:%02d:%06.3f",local_88.s._0_4_,
                          (ulong)local_bc,(ulong)uVar4,uVar5,(ulong)(local_88.D - 1),
                          (ulong)(uint)local_88.h,(ulong)(uint)local_88.m);
      sqlite3ResultStrAccum(context,&local_58);
    }
  }
  return;
}

Assistant:

static void timediffFunc(
  sqlite3_context *context,
  int NotUsed1,
  sqlite3_value **argv
){
  char sign;
  int Y, M;
  DateTime d1, d2;
  sqlite3_str sRes;
  UNUSED_PARAMETER(NotUsed1);
  if( isDate(context, 1, &argv[0], &d1) ) return;
  if( isDate(context, 1, &argv[1], &d2) ) return;
  computeYMD_HMS(&d1);
  computeYMD_HMS(&d2);
  if( d1.iJD>=d2.iJD ){
    sign = '+';
    Y = d1.Y - d2.Y;
    if( Y ){
      d2.Y = d1.Y;
      d2.validJD = 0;
      computeJD(&d2);
    }
    M = d1.M - d2.M;
    if( M<0 ){
      Y--;
      M += 12;
    }
    if( M!=0 ){
      d2.M = d1.M;
      d2.validJD = 0;
      computeJD(&d2);
    }
    while( d1.iJD<d2.iJD ){
      M--;
      if( M<0 ){
        M = 11;
        Y--;
      }
      d2.M--;
      if( d2.M<1 ){
        d2.M = 12;
        d2.Y--;
      }
      d2.validJD = 0;
      computeJD(&d2);
    }
    d1.iJD -= d2.iJD;
    d1.iJD += (u64)1486995408 * (u64)100000;
  }else /* d1<d2 */{
    sign = '-';
    Y = d2.Y - d1.Y;
    if( Y ){
      d2.Y = d1.Y;
      d2.validJD = 0;
      computeJD(&d2);
    }
    M = d2.M - d1.M;
    if( M<0 ){
      Y--;
      M += 12;
    }
    if( M!=0 ){
      d2.M = d1.M;
      d2.validJD = 0;
      computeJD(&d2);
    }
    while( d1.iJD>d2.iJD ){
      M--;
      if( M<0 ){
        M = 11;
        Y--;
      }
      d2.M++;
      if( d2.M>12 ){
        d2.M = 1;
        d2.Y++;
      }
      d2.validJD = 0;
      computeJD(&d2);
    }
    d1.iJD = d2.iJD - d1.iJD;
    d1.iJD += (u64)1486995408 * (u64)100000;
  }
  clearYMD_HMS_TZ(&d1);
  computeYMD_HMS(&d1);
  sqlite3StrAccumInit(&sRes, 0, 0, 0, 100);
  sqlite3_str_appendf(&sRes, "%c%04d-%02d-%02d %02d:%02d:%06.3f",
       sign, Y, M, d1.D-1, d1.h, d1.m, d1.s);
  sqlite3ResultStrAccum(context, &sRes);
}